

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

bool __thiscall
dxil_spv::CFGStructurizer::query_reachability_through_back_edges
          (CFGStructurizer *this,CFGNode *from,CFGNode *to)

{
  bool bVar1;
  
  bVar1 = CFGNode::dominates(to,from);
  if (bVar1) {
    to = to->pred_back_edge;
    if (to == (CFGNode *)0x0) {
      return false;
    }
    if (to != from) {
LAB_0013ae4c:
      return ((this->reachability_bitset).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(ulong)(this->reachability_stride * from->forward_post_visit_order) +
               (ulong)(to->forward_post_visit_order >> 5)] >> (to->forward_post_visit_order & 0x1f)
             & 1) != 0;
    }
  }
  else if (from != to) goto LAB_0013ae4c;
  return true;
}

Assistant:

bool CFGStructurizer::query_reachability_through_back_edges(const CFGNode &from, const CFGNode &to) const
{
	if (to.dominates(&from))
	{
		// If we're dominated by end node, only way we can reach is through a back edge.
		return to.pred_back_edge && query_reachability(from, *to.pred_back_edge);
	}
	else
		return query_reachability(from, to);
}